

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Platform_unix.cpp
# Opt level: O0

char * xmrig::Platform::createUserAgent(void)

{
  int iVar1;
  int iVar2;
  char *__s;
  undefined8 uVar3;
  int length;
  char *buf;
  size_t max;
  
  __s = (char *)operator_new__(0x100);
  memset(__s,0,0x100);
  iVar1 = snprintf(__s,0x100,"%s/%s (Linux ","XMRig","5.0.0");
  uVar3 = uv_version_string();
  iVar2 = snprintf(__s + iVar1,0x100 - (long)iVar1,"x86_64) libuv/%s",uVar3);
  snprintf(__s + (iVar2 + iVar1),0x100 - (long)(iVar2 + iVar1)," clang/%d.%d.%d",0x13,1,5);
  return __s;
}

Assistant:

char *xmrig::Platform::createUserAgent()
{
    constexpr const size_t max = 256;

    char *buf = new char[max]();
    int length = snprintf(buf, max, "%s/%s (Linux ", APP_NAME, APP_VERSION);

#   if defined(__x86_64__)
    length += snprintf(buf + length, max - length, "x86_64) libuv/%s", uv_version_string());
#   elif defined(__aarch64__)
    length += snprintf(buf + length, max - length, "aarch64) libuv/%s", uv_version_string());
#   elif defined(__arm__)
    length += snprintf(buf + length, max - length, "arm) libuv/%s", uv_version_string());
#   else
    length += snprintf(buf + length, max - length, "i686) libuv/%s", uv_version_string());
#   endif

#   ifdef XMRIG_NVIDIA_PROJECT
    const int cudaVersion = cuda_get_runtime_version();
    length += snprintf(buf + length, max - length, " CUDA/%d.%d", cudaVersion / 1000, cudaVersion % 100);
#   endif

#   ifdef __clang__
    length += snprintf(buf + length, max - length, " clang/%d.%d.%d", __clang_major__, __clang_minor__, __clang_patchlevel__);
#   elif defined(__GNUC__)
    length += snprintf(buf + length, max - length, " gcc/%d.%d.%d", __GNUC__, __GNUC_MINOR__, __GNUC_PATCHLEVEL__);
#   endif

    return buf;
}